

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool list_join(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_class_t *pgVar2;
  gravity_class_t *__src;
  int iVar3;
  uint uVar4;
  char *s;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  size_t __n;
  gravity_class_t *pgVar6;
  _Bool _Var7;
  uint32_t len;
  gravity_class_t *pgVar8;
  ulong uVar9;
  uint32_t alloc;
  long lVar10;
  long lVar11;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar12;
  size_t local_60;
  
  pgVar1 = (args->field_1).p;
  __n = 0;
  if ((nargs < 2) || (args[1].isa != gravity_class_string)) {
    pgVar8 = (gravity_class_t *)0x0;
  }
  else {
    pgVar8 = (args[1].field_1.p)->objclass;
  }
  uVar4 = *(int *)&pgVar1->objclass << 6;
  local_60 = 0x100;
  if (uVar4 != 0) {
    local_60 = (size_t)uVar4;
  }
  if (pgVar8 != (gravity_class_t *)0x0) {
    __n = (size_t)*(uint *)((long)&(args[1].field_1.p)->identifier + 4);
  }
  lVar11 = 1;
  s = (char *)gravity_calloc(vm,1,local_60);
  if (s == (char *)0x0) {
LAB_0011a061:
    _Var7 = false;
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,rindex);
  }
  else {
    pgVar2 = pgVar1->objclass;
    uVar9 = 0;
    pgVar6 = (gravity_class_t *)0x0;
    if (0 < (long)pgVar2) {
      pgVar6 = pgVar2;
    }
    lVar10 = 8;
    while( true ) {
      len = (uint32_t)uVar9;
      alloc = (uint32_t)local_60;
      if (lVar11 - (long)pgVar6 == 1) break;
      gVar12.field_1.n =
           ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(*(long *)&pgVar1->has_outer + lVar10))
           ->n;
      gVar12.isa = *(gravity_class_t **)(*(long *)&pgVar1->has_outer + -8 + lVar10);
      gVar12 = convert_value2string(vm,gVar12);
      aVar5 = gVar12.field_1;
      if (gVar12.isa == (gravity_class_t *)0x0) {
        free(s);
        pgVar8 = (gravity_class_t *)0x0;
        goto LAB_0011a035;
      }
      __src = (aVar5.p)->objclass;
      uVar4 = *(uint32_t *)((long)&(aVar5.p)->identifier + 4);
      iVar3 = (int)__n;
      if (alloc - len < uVar4 + iVar3 + 1) {
        local_60 = (size_t)(alloc + (uVar4 + iVar3) * 2 + 0x1000);
        s = (char *)gravity_realloc(vm,s,local_60);
        if (s == (char *)0x0) goto LAB_0011a061;
      }
      memcpy(s + uVar9,__src,(ulong)uVar4);
      uVar9 = (ulong)(len + uVar4);
      s[uVar9] = '\0';
      if ((lVar11 < (long)pgVar2) && (iVar3 != 0)) {
        memcpy(s + uVar9,pgVar8,__n);
        uVar9 = (ulong)(len + uVar4 + iVar3);
        s[uVar9] = '\0';
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x10;
    }
    aVar5.p = (gravity_object_t *)gravity_string_new(vm,s,len,alloc);
    pgVar8 = (aVar5.p)->isa;
LAB_0011a035:
    value.field_1.n = aVar5.n;
    value.isa = pgVar8;
    gravity_vm_setslot(vm,value,rindex);
    _Var7 = true;
  }
  return _Var7;
}

Assistant:

static bool list_join (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    const char *sep = NULL;
    if ((nargs > 1) && VALUE_ISA_STRING(GET_VALUE(1))) sep = VALUE_AS_CSTRING(GET_VALUE(1));

    // create a new empty buffer
    uint32_t alloc = (uint32_t) (marray_size(list->array) * 64);
    if (alloc == 0) alloc = 256;
    uint32_t len = 0;
    uint32_t seplen = (sep) ? VALUE_AS_STRING(GET_VALUE(1))->len : 0;
    char *_buffer = mem_alloc(vm, alloc);
    CHECK_MEM_ALLOC(_buffer);

    register gravity_int_t n = marray_size(list->array);
    register gravity_int_t i = 0;

    // traverse list and append each item
    while (i < n) {
        gravity_value_t value = convert_value2string(vm, marray_get(list->array, i));
        if (VALUE_ISA_ERROR(value)) {
            mem_free(_buffer);
            RETURN_VALUE(value, rindex);
        }

        // compute string to append
        const char *s2 = VALUE_AS_STRING(value)->s;
        uint32_t req = VALUE_AS_STRING(value)->len;
        uint32_t free_mem = alloc - len;

        // check if buffer needs to be reallocated
        if (free_mem < req + seplen + 1) {
            uint64_t to_alloc = alloc + (req + seplen) * 2 + 4096;
            _buffer = mem_realloc(vm, _buffer, (uint32_t)to_alloc);
            if (!_buffer) {
                mem_free(_buffer);
                RETURN_ERROR_SIMPLE();
            }
            alloc = (uint32_t)to_alloc;
        }

        // copy s2 to into buffer
        memcpy(_buffer+len, s2, req);
        len += req;

        // NULL terminate the C string
        _buffer[len] = 0;
        
        // check for separator string
        if (i+1 < n && seplen) {
            memcpy(_buffer+len, sep, seplen);
            len += seplen;
            _buffer[len] = 0;
        }

        ++i;
    }

    gravity_string_t *result = gravity_string_new(vm, _buffer, len, alloc);
    RETURN_VALUE(VALUE_FROM_OBJECT(result), rindex);
}